

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

void AimBulletMissile(AActor *proj,AActor *puff,int flags,bool temp,bool cba)

{
  DAngle local_50;
  DAngle local_48;
  DAngle local_40;
  DAngle local_38;
  DAngle local_30;
  
  if (puff != (AActor *)0x0) {
    local_30.Degrees = 0.0;
    local_38.Degrees = 0.0;
    local_40.Degrees = 0.0;
    local_48.Degrees = 0.0;
    A_Face(proj,puff,&local_30,&local_38,&local_40,&local_48,1,0.0);
    local_50.Degrees = (proj->Angles).Pitch.Degrees;
    AActor::Vel3DFromAngle(proj,&local_50,proj->Speed);
    if (temp) {
      (*(puff->super_DThinker).super_DObject._vptr_DObject[4])(puff);
    }
    else {
      if (cba) {
        if ((flags & 0x20U) != 0) {
          (proj->target).field_0.p = puff;
        }
        if ((flags & 0x40U) != 0) {
          (proj->master).field_0.p = puff;
        }
        if (-1 < (char)flags) {
          return;
        }
      }
      else {
        if ((flags & 0x40U) != 0) {
          (proj->target).field_0.p = puff;
        }
        if ((char)flags < '\0') {
          (proj->master).field_0.p = puff;
        }
        if (((uint)flags >> 8 & 1) == 0) {
          return;
        }
      }
      (proj->tracer).field_0.p = puff;
    }
  }
  return;
}

Assistant:

static void AimBulletMissile(AActor *proj, AActor *puff, int flags, bool temp, bool cba)
{
	if (proj && puff)
	{
		if (proj)
		{
			// FAF_BOTTOM = 1
			// Aim for the base of the puff as that's where blood puffs will spawn... roughly.

			A_Face(proj, puff, 0., 0., 0., 0., 1);
			proj->Vel3DFromAngle(proj->Angles.Pitch, proj->Speed);

			if (!temp)
			{
				if (cba)
				{
					if (flags & CBAF_PUFFTARGET)	proj->target = puff;
					if (flags & CBAF_PUFFMASTER)	proj->master = puff;
					if (flags & CBAF_PUFFTRACER)	proj->tracer = puff;
				}
				else
				{
					if (flags & FBF_PUFFTARGET)	proj->target = puff;
					if (flags & FBF_PUFFMASTER)	proj->master = puff;
					if (flags & FBF_PUFFTRACER)	proj->tracer = puff;
				}
			}
		}
	}
	if (puff && temp)
	{
		puff->Destroy();
	}
}